

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmuni_cs.cpp
# Opt level: O0

wchar_t t3_simple_case_fold(wchar_t ch)

{
  uint uVar1;
  wchar_t local_1c;
  wchar_t local_18;
  int ofs;
  case_table *e;
  wchar_t ch_local;
  wchar_t local_4;
  
  if (case_tab[ch >> 7] == (case_table *)0x0) {
    local_4 = L'\0';
  }
  else {
    uVar1 = (uint)case_tab[ch >> 7][ch & 0x7f].lower;
    local_18 = ch;
    if (uVar1 != 0) {
      local_1c = ch;
      if (case_expansion[(int)(uVar1 + 1)] == L'\0') {
        local_1c = case_expansion[(int)uVar1];
      }
      local_18 = local_1c;
    }
    local_4 = local_18;
  }
  return local_4;
}

Assistant:

wchar_t t3_simple_case_fold(wchar_t ch)
{
    case_table *e = case_tab[ch >> 7];
    if (e == 0)
        return 0;
    int ofs = e[ch & 127].lower;
    return ofs == 0 ? ch :
           case_expansion[ofs + 1] != 0 ? ch :
           case_expansion[ofs];
}